

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Cache * leveldb::NewLRUCache(size_t capacity)

{
  undefined8 *puVar1;
  long lVar2;
  Cache *pCVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (Cache *)operator_new(0xdc0);
  pCVar3->_vptr_Cache = (_func_int **)&PTR__ShardedLRUCache_00a289c0;
  lVar5 = 0;
  do {
    puVar1 = (undefined8 *)((long)&pCVar3[0xd].rep_ + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pCVar3[1]._vptr_Cache + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pCVar3[2]._vptr_Cache + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&pCVar3[3]._vptr_Cache + lVar5);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&pCVar3[4]._vptr_Cache + lVar5) = 0;
    anon_unknown_0::HandleTable::Resize((HandleTable *)((long)&pCVar3[0xd].rep_ + lVar5));
    lVar4 = (long)&pCVar3[4].rep_ + lVar5;
    *(long *)((long)&pCVar3[6]._vptr_Cache + lVar5) = lVar4;
    *(long *)((long)&pCVar3[6].rep_ + lVar5) = lVar4;
    lVar4 = (long)&pCVar3[9]._vptr_Cache + lVar5;
    *(long *)((long)&pCVar3[10].rep_ + lVar5) = lVar4;
    *(long *)((long)&pCVar3[0xb]._vptr_Cache + lVar5) = lVar4;
    lVar5 = lVar5 + 0xd8;
  } while (lVar5 != 0xd80);
  pCVar3[0xdb]._vptr_Cache = (_func_int **)0x0;
  pCVar3[0xdb].rep_ = (Rep *)0x0;
  pCVar3[0xda]._vptr_Cache = (_func_int **)0x0;
  pCVar3[0xda].rep_ = (Rep *)0x0;
  pCVar3[0xd9]._vptr_Cache = (_func_int **)0x0;
  pCVar3[0xd9].rep_ = (Rep *)0x0;
  for (lVar5 = 0x10; lVar5 != 0xd90; lVar5 = lVar5 + 0xd8) {
    *(size_t *)((long)&pCVar3->_vptr_Cache + lVar5) = capacity + 0xf >> 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return pCVar3;
  }
  __stack_chk_fail();
}

Assistant:

Cache* NewLRUCache(size_t capacity) { return new ShardedLRUCache(capacity); }